

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScalePlaneVertical(int src_height,int dst_width,int dst_height,int src_stride,int dst_stride,
                       uint8_t *src_argb,uint8_t *dst_argb,int x,int y,int dy,int bpp,
                       FilterMode filtering)

{
  uint uVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  long in_R9;
  int yf;
  int yi;
  int j;
  int max_y;
  _func_void_uint8_t_ptr_uint8_t_ptr_ptrdiff_t_int_int *InterpolateRow;
  int in_stack_00000020;
  int dst_width_bytes;
  int in_stack_00000030;
  uint local_48;
  int local_44;
  int in_stack_ffffffffffffffc4;
  int local_38;
  code *local_30;
  
  uVar1 = in_ESI * (int)src_argb;
  local_30 = InterpolateRow_C;
  if (in_EDI < 2) {
    local_44 = 0;
  }
  else {
    local_44 = (in_EDI + -1) * 0x10000 + -1;
  }
  iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffffc4);
  if ((iVar2 != 0) && (local_30 = InterpolateRow_Any_SSSE3, (uVar1 & 0xf) == 0)) {
    local_30 = InterpolateRow_SSSE3;
  }
  iVar2 = libyuv::TestCpuFlag(in_stack_ffffffffffffffc4);
  if ((iVar2 != 0) && (local_30 = InterpolateRow_Any_AVX2, (uVar1 & 0x1f) == 0)) {
    local_30 = InterpolateRow_AVX2;
  }
  for (local_38 = 0; local_38 < in_EDX; local_38 = local_38 + 1) {
    if (local_44 < (int)InterpolateRow) {
      InterpolateRow._0_4_ = local_44;
    }
    if (in_stack_00000030 == 0) {
      local_48 = 0;
    }
    else {
      local_48 = (int)InterpolateRow >> 8 & 0xff;
    }
    (*local_30)(_yf,in_R9 + (j >> 0x10) * (int)src_argb +
                    (long)(((int)InterpolateRow >> 0x10) * in_ECX),(long)in_ECX,uVar1,local_48);
    _yf = _yf + in_R8D;
    InterpolateRow._0_4_ = in_stack_00000020 + (int)InterpolateRow;
  }
  return;
}

Assistant:

void ScalePlaneVertical(int src_height,
                        int dst_width,
                        int dst_height,
                        int src_stride,
                        int dst_stride,
                        const uint8_t* src_argb,
                        uint8_t* dst_argb,
                        int x,
                        int y,
                        int dy,
                        int bpp,
                        enum FilterMode filtering) {
  // TODO(fbarchard): Allow higher bpp.
  int dst_width_bytes = dst_width * bpp;
  void (*InterpolateRow)(uint8_t * dst_argb, const uint8_t* src_argb,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  const int max_y = (src_height > 1) ? ((src_height - 1) << 16) - 1 : 0;
  int j;
  assert(bpp >= 1 && bpp <= 4);
  assert(src_height != 0);
  assert(dst_width > 0);
  assert(dst_height > 0);
  src_argb += (x >> 16) * bpp;
#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width_bytes, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width_bytes, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MMI)
  if (TestCpuFlag(kCpuHasMMI)) {
    InterpolateRow = InterpolateRow_Any_MMI;
    if (IS_ALIGNED(dst_width_bytes, 8)) {
      InterpolateRow = InterpolateRow_MMI;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_MSA)
  if (TestCpuFlag(kCpuHasMSA)) {
    InterpolateRow = InterpolateRow_Any_MSA;
    if (IS_ALIGNED(dst_width_bytes, 32)) {
      InterpolateRow = InterpolateRow_MSA;
    }
  }
#endif
  for (j = 0; j < dst_height; ++j) {
    int yi;
    int yf;
    if (y > max_y) {
      y = max_y;
    }
    yi = y >> 16;
    yf = filtering ? ((y >> 8) & 255) : 0;
    InterpolateRow(dst_argb, src_argb + yi * src_stride, src_stride,
                   dst_width_bytes, yf);
    dst_argb += dst_stride;
    y += dy;
  }
}